

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixRotateY(Matrix *__return_storage_ptr__,float angle)

{
  float fVar1;
  float fVar2;
  Matrix *result;
  float sinres;
  float cosres;
  float angle_local;
  
  MatrixIdentity();
  fVar1 = cosf(angle);
  fVar2 = sinf(angle);
  __return_storage_ptr__->m0 = fVar1;
  __return_storage_ptr__->m2 = fVar2;
  __return_storage_ptr__->m8 = -fVar2;
  __return_storage_ptr__->m10 = fVar1;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotateY(float angle)
{
    Matrix result = MatrixIdentity();

    float cosres = cosf(angle);
    float sinres = sinf(angle);

    result.m0 = cosres;
    result.m2 = sinres;
    result.m8 = -sinres;
    result.m10 = cosres;

    return result;
}